

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_parser.cc
# Opt level: O3

void __thiscall xsettingsd::ConfigParser::Reset(ConfigParser *this,CharStream *stream)

{
  if (stream != (CharStream *)0x0) {
    if (this->stream_ != (CharStream *)0x0) {
      (*this->stream_->_vptr_CharStream[1])();
    }
    this->stream_ = stream;
    this->error_line_num_ = 0;
    (this->error_str_)._M_string_length = 0;
    *(this->error_str_)._M_dataplus._M_p = '\0';
    return;
  }
  __assert_fail("stream",
                "/workspace/llm4binary/github/license_c_cmakelists/derat[P]xsettingsd/config_parser.cc"
                ,0x26,"void xsettingsd::ConfigParser::Reset(CharStream *)");
}

Assistant:

void ConfigParser::Reset(CharStream* stream) {
  assert(stream);
  delete stream_;
  stream_ = stream;

  error_line_num_ = 0;
  error_str_.clear();
}